

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O1

int __thiscall HebrewCalendar::operator_cast_to_int(HebrewCalendar *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HebrewCalendar *this_00;
  int iVar5;
  
  iVar3 = (this->super_Calendar).month;
  iVar5 = (this->super_Calendar).day;
  if (iVar3 < 7) {
    iVar1 = (this->super_Calendar).year;
    iVar4 = 7;
    do {
      this_00 = this;
      iVar2 = LastMonthDay(this,iVar4,iVar1);
      iVar5 = iVar5 + iVar2;
      iVar4 = iVar4 + 1;
    } while (((iVar1 * 7 + 1) % 0x13 < 7) + 0xd != iVar4);
    if (1 < iVar3) {
      iVar4 = 1;
      do {
        this_00 = this;
        iVar2 = LastMonthDay(this,iVar4,iVar1);
        iVar5 = iVar5 + iVar2;
        iVar4 = iVar4 + 1;
      } while (iVar3 != iVar4);
    }
  }
  else {
    this_00 = this;
    if (iVar3 != 7) {
      iVar1 = (this->super_Calendar).year;
      iVar4 = 7;
      do {
        this_00 = this;
        iVar2 = LastMonthDay(this,iVar4,iVar1);
        iVar5 = iVar5 + iVar2;
        iVar4 = iVar4 + 1;
      } while (iVar3 != iVar4);
    }
  }
  iVar3 = HebrewCalendarElapsedDays(this_00,(this->super_Calendar).year);
  return iVar3 + iVar5 + -0x14f4f5;
}

Assistant:

HebrewCalendar::operator int() { // Computes the absolute date of HebrewCalendar date.
    int DayInYear = day; // Days so far this month.
    if (month < 7) { // Before Tishri, so add days in prior months
        // this year before and after Nisan.
        int m = 7;
        while (m <= (LastMonthOfHebrewYear(year))) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        };
        m = 1;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    else { // Add days in prior months this year
        int m = 7;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    int d = DayInYear +
            (HebrewCalendarElapsedDays(year)// Days in prior years.
                    + HebrewEpoch);
    return d;         // Days elapsed before absolute date 1.
}